

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lua-bson.c
# Opt level: O2

int lobjectid(lua_State *L)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  char *pcVar4;
  time_t tVar5;
  long lVar6;
  uint8_t oid [14];
  size_t len;
  
  oid[8] = '\0';
  oid[9] = '\0';
  oid[10] = '\0';
  oid[0xb] = '\0';
  oid[0xc] = '\0';
  oid[0xd] = '\0';
  oid[0] = '\0';
  oid[1] = '\a';
  oid[2] = '\0';
  oid[3] = '\0';
  oid[4] = '\0';
  oid[5] = '\0';
  oid[6] = '\0';
  oid[7] = '\0';
  iVar1 = lua_isstring(L,1);
  if (iVar1 == 0) {
    tVar5 = time((time_t *)0x0);
    LOCK();
    UNLOCK();
    uVar3 = (uint)tVar5;
    oid._2_4_ = uVar3 >> 0x18 | (uVar3 & 0xff0000) >> 8 | (uVar3 & 0xff00) << 8 | uVar3 << 0x18;
    oid._6_2_ = (undefined2)oid_header._0_4_;
    oid._8_2_ = SUB42(oid_header._0_4_,2);
    oid[10] = oid_header[4];
    oid[0xb] = (uint8_t)(oid_counter >> 0x10);
    oid[0xc] = (uint8_t)(oid_counter >> 8);
    oid[0xd] = (uint8_t)oid_counter;
    oid_counter = oid_counter + 1;
  }
  else {
    pcVar4 = lua_tolstring(L,1,&len);
    if (len != 0x18) {
      iVar1 = luaL_error(L,"Invalid objectid %s",pcVar4);
      return iVar1;
    }
    for (lVar6 = 0; lVar6 != 0xc; lVar6 = lVar6 + 1) {
      iVar1 = hextoint(pcVar4[lVar6 * 2]);
      iVar2 = hextoint(pcVar4[lVar6 * 2 + 1]);
      oid[lVar6 + 2] = (byte)iVar2 | (byte)(iVar1 << 4);
    }
  }
  lua_pushlstring(L,(char *)oid,0xe);
  return 1;
}

Assistant:

static int
lobjectid(lua_State *L) {
	uint8_t oid[14] = { 0, BSON_OBJECTID };
	if (lua_isstring(L,1)) {
		size_t len;
		const char * str = lua_tolstring(L,1,&len);
		if (len != 24) {
			return luaL_error(L, "Invalid objectid %s", str);
		}
		int i;
		for (i=0;i<12;i++) {
			oid[i+2] = hextoint(str[i*2]) << 4 | hextoint(str[i*2+1]);
		}
	} else {
		time_t ti = time(NULL);
		// old_counter is a static var, use atom inc.
		uint32_t id = ATOM_FINC(&oid_counter);

		oid[2] = (ti>>24) & 0xff;
		oid[3] = (ti>>16) & 0xff;
		oid[4] = (ti>>8) & 0xff;
		oid[5] = ti & 0xff;
		memcpy(oid+6 , oid_header, 5);
		oid[11] = (id>>16) & 0xff; 
		oid[12] = (id>>8) & 0xff; 
		oid[13] = id & 0xff;
	}
	lua_pushlstring( L, (const char *)oid, 14);

	return 1;
}